

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_export_ostream.cpp
# Opt level: O0

void __thiscall
gtest_suite_UnsignedToString_::Zero<unsigned_long_long>::TestBody(Zero<unsigned_long_long> *this)

{
  bool bVar1;
  char *message;
  pair<const_char_*,_const_char_*> pVar2;
  AssertHelper local_98;
  Message local_90 [3];
  allocator<char> local_71;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  undefined1 local_50 [8];
  AssertionResult gtest_ar;
  char *local_38;
  pair<const_char_*,_const_char_*> x;
  base10storage<TypeParam>_conflict1 out;
  Zero<unsigned_long_long> *this_local;
  
  pstore::gsl::not_null<std::array<char,_20UL>_*>::not_null
            ((not_null<std::array<char,_20UL>_*> *)&gtest_ar.message_,
             (array<char,_20UL> *)((long)&x.second + 4));
  pVar2 = pstore::exchange::export_ns::details::to_characters<unsigned_long_long,_void>
                    (0,(not_null<std::array<char,_20UL>_*>)
                       gtest_ar.message_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl);
  local_38 = pVar2.first;
  x.first = pVar2.second;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<char_const*,void>((string *)&local_70,local_38,x.first,&local_71);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[2],_nullptr>
            ((EqHelper *)local_50,"(std::string{x.first, x.second})","\"0\"",&local_70,
             (char (*) [2])0x3022f5);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_50);
  if (!bVar1) {
    testing::Message::Message(local_90);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_50);
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_export_ostream.cpp"
               ,0x2a,message);
    testing::internal::AssertHelper::operator=(&local_98,local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    testing::Message::~Message(local_90);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
  return;
}

Assistant:

TYPED_TEST_P (UnsignedToString, Zero) {
    using namespace pstore::exchange::export_ns::details;
    base10storage<TypeParam> out;
    std::pair<char const *, char const *> const x = to_characters (TypeParam{0}, &out);
    EXPECT_EQ ((std::string{x.first, x.second}), "0");
}